

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetDefaultBlindingKey
              (void *handle,char *master_blinding_key,char *locking_script,char **blinding_key)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  Privkey privkey;
  Script *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffe00;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  Script local_198;
  allocator local_159;
  string local_158;
  Privkey local_138;
  Privkey local_118;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x448;
    local_50.funcname = "CfdGetDefaultBlindingKey";
    cfd::core::logger::warn<>(&local_50,"master blinding key is null or empty.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"Failed to parameter. master blinding key is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (!bVar1) {
    if (local_28 == (undefined8 *)0x0) {
      local_d0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                   ,0x2f);
      local_d0.filename = local_d0.filename + 1;
      local_d0.line = 0x454;
      local_d0.funcname = "CfdGetDefaultBlindingKey";
      cfd::core::logger::warn<>(&local_d0,"blinding key is null.");
      local_f2 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"Failed to parameter. blinding key is null.",&local_f1);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
      local_f2 = 0;
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_158,local_18,&local_159);
    cfd::core::Privkey::Privkey(&local_138,&local_158,kMainnet,true);
    paVar4 = &local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,local_20,paVar4);
    cfd::core::Script::Script(&local_198,&local_1b8);
    cfd::core::ElementsConfidentialAddress::GetBlindingKey(&local_118,&local_138,&local_198);
    cfd::core::Script::~Script(in_stack_fffffffffffffda0);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    cfd::core::Privkey::~Privkey((Privkey *)0x5ad805);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_1e0,&local_118);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe00);
    *local_28 = pcVar3;
    std::__cxx11::string::~string((string *)&local_1e0);
    local_4 = 0;
    cfd::core::Privkey::~Privkey((Privkey *)0x5ad87f);
    return local_4;
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x44e;
  local_90.funcname = "CfdGetDefaultBlindingKey";
  cfd::core::logger::warn<>(&local_90,"locking script is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,"Failed to parameter. locking script is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetDefaultBlindingKey(
    void* handle, const char* master_blinding_key, const char* locking_script,
    char** blinding_key) {
  try {
    cfd::Initialize();
    if (IsEmptyString(master_blinding_key)) {
      warn(CFD_LOG_SOURCE, "master blinding key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master blinding key is null or empty.");
    }
    if (IsEmptyString(locking_script)) {
      warn(CFD_LOG_SOURCE, "locking script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. locking script is null or empty.");
    }
    if (blinding_key == nullptr) {
      warn(CFD_LOG_SOURCE, "blinding key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding key is null.");
    }

    Privkey privkey = ElementsConfidentialAddress::GetBlindingKey(
        Privkey(std::string(master_blinding_key)),
        Script(std::string(locking_script)));
    *blinding_key = CreateString(privkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}